

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_stroke_curve
               (nk_draw_list *list,nk_vec2 p0,nk_vec2 cp0,nk_vec2 cp1,nk_vec2 p1,nk_color col,
               uint segments,float thickness)

{
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x27cb,
                  "void nk_draw_list_stroke_curve(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, struct nk_vec2, struct nk_vec2, struct nk_color, unsigned int, float)"
                 );
  }
  if ((uint)col < 0x1000000) {
    return;
  }
  nk_draw_list_path_line_to(list,p0);
  nk_draw_list_path_curve_to(list,cp0,cp1,p1,segments);
  nk_draw_list_path_stroke(list,col,NK_STROKE_OPEN,thickness);
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_curve(struct nk_draw_list *list, struct nk_vec2 p0,
    struct nk_vec2 cp0, struct nk_vec2 cp1, struct nk_vec2 p1,
    struct nk_color col, unsigned int segments, float thickness)
{
    NK_ASSERT(list);
    if (!list || !col.a) return;
    nk_draw_list_path_line_to(list, p0);
    nk_draw_list_path_curve_to(list, cp0, cp1, p1, segments);
    nk_draw_list_path_stroke(list, col, NK_STROKE_OPEN, thickness);
}